

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteRuleHashes(cmGlobalGenerator *this,string *pfile)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  cmGeneratedFileStream fout;
  
  if ((this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,pfile,false,None);
    std::operator<<((ostream *)&fout,"# Hashes of file build rules.\n");
    for (p_Var2 = (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->RuleHashes)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::ostream::write((char *)&fout,(long)(p_Var2 + 2));
      poVar1 = std::operator<<((ostream *)&fout," ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
      std::operator<<(poVar1,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    return;
  }
  cmsys::SystemTools::RemoveFile(pfile);
  return;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}